

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmGeneratorTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,cmTargetExport *te)

{
  cmListFileBacktrace *this_00;
  cmValue cVar1;
  bool bVar2;
  pointer pcVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  ostream *poVar6;
  ulong uVar7;
  char *__lhs;
  mapped_type *this_01;
  allocator<char> local_421;
  key_type local_420;
  allocator<char> local_3f9;
  string local_3f8;
  undefined1 local_3d8 [8];
  string prepro;
  char *sep;
  undefined1 local_388 [8];
  string includes;
  key_type local_360;
  undefined4 local_33c;
  string local_338;
  undefined1 local_318 [8];
  ostringstream e;
  cmLocalGenerator *lg;
  allocator<char> local_171;
  string local_170;
  undefined1 local_150 [8];
  string exportDirs;
  undefined1 local_110 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string_view local_f8;
  cmStringRange local_e8;
  string local_d8;
  undefined1 local_b8 [8];
  string dirs;
  undefined1 local_88 [8];
  cmGeneratorExpression ge;
  allocator<char> local_61;
  string local_60;
  cmValue local_40;
  cmValue input;
  char *propName;
  cmTargetExport *te_local;
  ImportPropertyMap *properties_local;
  PreprocessContext preprocessRule_local;
  cmGeneratorTarget *target_local;
  cmExportFileGenerator *this_local;
  
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x179,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(const cmGeneratorTarget *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, const cmTargetExport &)"
                 );
  }
  input.Value = (string *)anon_var_dwarf_2bd413;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"INTERFACE_INCLUDE_DIRECTORIES",&local_61);
  local_40 = cmGeneratorTarget::GetProperty(target,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  dirs.field_2._8_8_ = 0;
  this_00 = (cmListFileBacktrace *)((long)&dirs.field_2 + 8);
  cmListFileBacktrace::cmListFileBacktrace(this_00);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_88,this_00);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)((long)&dirs.field_2 + 8));
  local_e8 = cmTarget::GetInstallIncludeDirectoriesEntries_abi_cxx11_(target->Target,te);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,";");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&cge);
  cmJoin(&local_d8,&local_e8,local_f8,_cge);
  cmGeneratorExpression::Preprocess((string *)local_b8,&local_d8,InstallInterface,true);
  std::__cxx11::string::~string((string *)&local_d8);
  (*this->_vptr_cmExportFileGenerator[0x13])(this,local_b8);
  std::__cxx11::string::string((string *)(exportDirs.field_2._M_local_buf + 8),(string *)local_b8);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_110,(string *)local_88);
  std::__cxx11::string::~string((string *)(exportDirs.field_2._M_local_buf + 8));
  pcVar3 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)local_110);
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"",&local_171);
  std::__cxx11::string::string((string *)&lg);
  psVar5 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar3,pcVar4,&local_170,target,(cmGeneratorExpressionDAGChecker *)0x0,
                      (cmGeneratorTarget *)0x0,(string *)&lg);
  std::__cxx11::string::string((string *)local_150,(string *)psVar5);
  std::__cxx11::string::~string((string *)&lg);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pcVar3 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)local_110);
  bVar2 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar3);
  if (bVar2) {
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    poVar6 = std::operator<<((ostream *)local_318,"Target \"");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar6 = std::operator<<(poVar6,(string *)psVar5);
    std::operator<<(poVar6,
                    "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                   );
    std::__cxx11::ostringstream::str();
    cmLocalGenerator::IssueMessage(pcVar4,FATAL_ERROR,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    local_33c = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
    goto LAB_0061f46c;
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_40);
  if (!bVar2) {
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      local_33c = 1;
      goto LAB_0061f46c;
    }
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_40);
  if (bVar2) {
    cmValue::operator->[abi_cxx11_(&local_40);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) != 0) {
      uVar7 = std::__cxx11::string::empty();
      cVar1 = input;
      if ((uVar7 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_360,(char *)cVar1.Value,
                   (allocator<char> *)(includes.field_2._M_local_buf + 0xf));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](properties,&local_360);
        std::__cxx11::string::clear();
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator((allocator<char> *)(includes.field_2._M_local_buf + 0xf));
        local_33c = 1;
        goto LAB_0061f46c;
      }
    }
  }
  prefixItems((string *)local_150);
  bVar2 = cmValue::operator_cast_to_bool(&local_40);
  sep._6_1_ = 0;
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_40);
    std::__cxx11::string::string((string *)local_388,(string *)psVar5);
  }
  else {
    std::allocator<char>::allocator();
    sep._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_388,"",(allocator<char> *)((long)&sep + 7));
  }
  if ((sep._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 7));
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_40);
  __lhs = "";
  if (bVar2) {
    __lhs = ";";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prepro.field_2 + 8),__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  std::__cxx11::string::operator+=((string *)local_388,(string *)(prepro.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(prepro.field_2._M_local_buf + 8));
  cmGeneratorExpression::Preprocess((string *)local_3d8,(string *)local_388,InstallInterface,true);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    ResolveTargetsInGeneratorExpressions(this,(string *)local_3d8,target,NoReplaceFreeTargets);
    cVar1 = input;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,(char *)cVar1.Value,&local_3f9);
    bVar2 = checkInterfaceDirs((string *)local_3d8,target,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    cVar1 = input;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_420,(char *)cVar1.Value,&local_421);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](properties,&local_420);
      std::__cxx11::string::operator=((string *)this_01,(string *)local_3d8);
      std::__cxx11::string::~string((string *)&local_420);
      std::allocator<char>::~allocator(&local_421);
      goto LAB_0061f44a;
    }
    local_33c = 1;
  }
  else {
LAB_0061f44a:
    local_33c = 0;
  }
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::string::~string((string *)local_388);
LAB_0061f46c:
  std::__cxx11::string::~string((string *)local_150);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_110);
  std::__cxx11::string::~string((string *)local_b8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_88);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, cmTargetExport const& te)
{
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  cmValue input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
    cmJoin(target->Target->GetInstallIncludeDirectoriesEntries(te), ";"),
    preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && input->empty()) && exportDirs.empty()) {
    // Set to empty
    properties[propName].clear();
    return;
  }

  prefixItems(exportDirs);

  std::string includes = (input ? *input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}